

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O0

void __thiscall
qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
          (SquareMatrix<std::complex<double>_> *this,complex<double> m00,complex<double> m01,
          complex<double> m02,complex<double> m03,complex<double> m10,complex<double> m11,
          complex<double> m12,complex<double> m13,complex<double> m20,complex<double> m21,
          complex<double> m22,complex<double> m23,complex<double> m30,complex<double> m31,
          complex<double> m32,complex<double> m33)

{
  type pcVar1;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  SquareMatrix<std::complex<double>_> *this_local;
  complex<double> m03_local;
  complex<double> m02_local;
  complex<double> m01_local;
  complex<double> m00_local;
  
  this->size_ = 4;
  alloc_unique_array<std::complex<double>>((dense *)&this->data_,0x10);
  pcVar1 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
           operator[](&this->data_,0);
  *(undefined8 *)pcVar1->_M_value = in_XMM0_Qa;
  *(undefined8 *)(pcVar1->_M_value + 8) = in_XMM1_Qa;
  pcVar1 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
           operator[](&this->data_,1);
  *(undefined8 *)pcVar1->_M_value = m02._M_value._0_8_;
  *(undefined8 *)(pcVar1->_M_value + 8) = m02._M_value._8_8_;
  pcVar1 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
           operator[](&this->data_,2);
  *(undefined8 *)pcVar1->_M_value = m12._M_value._0_8_;
  *(undefined8 *)(pcVar1->_M_value + 8) = m12._M_value._8_8_;
  pcVar1 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
           operator[](&this->data_,3);
  *(undefined8 *)pcVar1->_M_value = m22._M_value._0_8_;
  *(undefined8 *)(pcVar1->_M_value + 8) = m22._M_value._8_8_;
  pcVar1 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
           operator[](&this->data_,4);
  *(undefined8 *)pcVar1->_M_value = in_XMM2_Qa;
  *(undefined8 *)(pcVar1->_M_value + 8) = in_XMM3_Qa;
  pcVar1 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
           operator[](&this->data_,5);
  *(undefined8 *)pcVar1->_M_value = m03._M_value._0_8_;
  *(undefined8 *)(pcVar1->_M_value + 8) = m03._M_value._8_8_;
  pcVar1 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
           operator[](&this->data_,6);
  *(undefined8 *)pcVar1->_M_value = m13._M_value._0_8_;
  *(undefined8 *)(pcVar1->_M_value + 8) = m13._M_value._8_8_;
  pcVar1 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
           operator[](&this->data_,7);
  *(undefined8 *)pcVar1->_M_value = m23._M_value._0_8_;
  *(undefined8 *)(pcVar1->_M_value + 8) = m23._M_value._8_8_;
  pcVar1 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
           operator[](&this->data_,8);
  *(undefined8 *)pcVar1->_M_value = in_XMM4_Qa;
  *(undefined8 *)(pcVar1->_M_value + 8) = in_XMM5_Qa;
  pcVar1 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
           operator[](&this->data_,9);
  *(undefined8 *)pcVar1->_M_value = m10._M_value._0_8_;
  *(undefined8 *)(pcVar1->_M_value + 8) = m10._M_value._8_8_;
  pcVar1 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
           operator[](&this->data_,10);
  *(undefined8 *)pcVar1->_M_value = m20._M_value._0_8_;
  *(undefined8 *)(pcVar1->_M_value + 8) = m20._M_value._8_8_;
  pcVar1 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
           operator[](&this->data_,0xb);
  *(undefined8 *)pcVar1->_M_value = m30._M_value._0_8_;
  *(undefined8 *)(pcVar1->_M_value + 8) = m30._M_value._8_8_;
  pcVar1 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
           operator[](&this->data_,0xc);
  *(undefined8 *)pcVar1->_M_value = in_XMM6_Qa;
  *(undefined8 *)(pcVar1->_M_value + 8) = in_XMM7_Qa;
  pcVar1 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
           operator[](&this->data_,0xd);
  *(undefined8 *)pcVar1->_M_value = m11._M_value._0_8_;
  *(undefined8 *)(pcVar1->_M_value + 8) = m11._M_value._8_8_;
  pcVar1 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
           operator[](&this->data_,0xe);
  *(undefined8 *)pcVar1->_M_value = m21._M_value._0_8_;
  *(undefined8 *)(pcVar1->_M_value + 8) = m21._M_value._8_8_;
  pcVar1 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
           operator[](&this->data_,0xf);
  *(undefined8 *)pcVar1->_M_value = m31._M_value._0_8_;
  *(undefined8 *)(pcVar1->_M_value + 8) = m31._M_value._8_8_;
  return;
}

Assistant:

SquareMatrix( const T m00 , const T m01 , const T m02 , const T m03 ,
                      const T m10 , const T m11 , const T m12 , const T m13 ,
                      const T m20 , const T m21 , const T m22 , const T m23 ,
                      const T m30 , const T m31 , const T m32 , const T m33 )
        : size_( 4 )
        , data_( alloc_unique_array< T >( 16 ) )
        {
          data_[ 0] = m00 ; data_[ 1] = m10 ; data_[ 2] = m20 ; data_[ 3] = m30;
          data_[ 4] = m01 ; data_[ 5] = m11 ; data_[ 6] = m21 ; data_[ 7] = m31;
          data_[ 8] = m02 ; data_[ 9] = m12 ; data_[10] = m22 ; data_[11] = m32;
          data_[12] = m03 ; data_[13] = m13 ; data_[14] = m23 ; data_[15] = m33;
        }